

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLinear.c
# Opt level: O1

int cuddInitLinear(DdManager *table)

{
  int iVar1;
  int iVar2;
  long *__s;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  
  iVar1 = table->size;
  iVar6 = iVar1 + -1 >> 6;
  uVar4 = (iVar6 + 1) * iVar1;
  __s = (long *)malloc((long)(int)uVar4 * 8);
  table->linear = __s;
  if (__s == (long *)0x0) {
    table->errorCode = CUDD_MEMORY_OUT;
    iVar2 = 0;
  }
  else {
    table->memused = table->memused + (long)(int)uVar4 * 8;
    table->linearSize = iVar1;
    if (0 < (int)uVar4) {
      memset(__s,0,(ulong)uVar4 << 3);
    }
    if (iVar1 < 1) {
      iVar2 = 1;
    }
    else {
      uVar3 = 0;
      lVar5 = 0;
      iVar2 = 1;
      do {
        __s[(uVar3 >> 6) + lVar5] = (long)(1 << ((byte)uVar3 & 0x1f));
        uVar3 = uVar3 + 1;
        lVar5 = lVar5 + (long)iVar6 + 1;
      } while (iVar1 != (int)uVar3);
    }
  }
  return iVar2;
}

Assistant:

int
cuddInitLinear(
  DdManager * table)
{
    int words;
    int wordsPerRow;
    int nvars;
    int word;
    int bit;
    int i;
    long *linear;

    nvars = table->size;
    wordsPerRow = ((nvars - 1) >> LOGBPL) + 1;
    words = wordsPerRow * nvars;
    table->linear = linear = ABC_ALLOC(long,words);
    if (linear == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }
    table->memused += words * sizeof(long);
    table->linearSize = nvars;
    for (i = 0; i < words; i++) linear[i] = 0;
    for (i = 0; i < nvars; i++) {
        word = wordsPerRow * i + (i >> LOGBPL);
        bit  = i & (BPL-1);
        linear[word] = 1 << bit;
    }
    return(1);

}